

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O2

void update_view(chunk_conflict *c,player *p)

{
  uint32_t *puVar1;
  int *piVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  loc grid_04;
  loc grid_05;
  loc grid_06;
  int iVar3;
  int iVar4;
  _Bool _Var5;
  wchar_t wVar7;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  loc lVar12;
  _Bool _Var6;
  wchar_t wVar8;
  square *psVar13;
  loc lVar14;
  monster *mon;
  loc_conflict lVar15;
  ulong uVar16;
  int iVar17;
  wchar_t y;
  int iVar18;
  wchar_t wVar19;
  ulong uVar20;
  ulong uVar21;
  wchar_t x_00;
  int iVar22;
  int y_00;
  long lVar23;
  wchar_t x;
  long lVar24;
  int iVar25;
  long lVar26;
  
  for (iVar18 = 0; iVar18 < c->height; iVar18 = iVar18 + 1) {
    for (iVar25 = 0; iVar25 < c->width; iVar25 = iVar25 + 1) {
      lVar12 = (loc)loc(iVar25,iVar18);
      _Var5 = square_isseen(c,lVar12);
      if (_Var5) {
        psVar13 = square(c,lVar12);
        flag_on_dbg(psVar13->info,3,7,"square(c, grid)->info","SQUARE_WASSEEN");
      }
      psVar13 = square(c,lVar12);
      flag_off(psVar13->info,3,6);
      psVar13 = square(c,lVar12);
      flag_off(psVar13->info,3,5);
      psVar13 = square(c,lVar12);
      flag_off(psVar13->info,3,0x15);
    }
  }
  wVar19 = (p->state).cur_light;
  wVar9 = -wVar19;
  if (L'\0' < wVar19) {
    wVar9 = wVar19;
  }
  lVar12.x = (p->grid).x;
  lVar12.y = (p->grid).y;
  wVar7 = square_light(c,lVar12);
  _Var5 = is_daytime();
  if (_Var5) {
    _Var5 = outside();
  }
  else {
    _Var5 = false;
  }
  for (lVar23 = 0; lVar23 < c->height; lVar23 = lVar23 + 1) {
    for (lVar26 = 0; lVar26 < c->width; lVar26 = lVar26 + 1) {
      lVar12 = (loc)loc((int)lVar26,(int)lVar23);
      _Var6 = square_isglow(c,lVar12);
      if (!_Var6) goto LAB_00128db0;
      iVar18 = 1;
      if (_Var5 == false) {
        _Var6 = square_allowslos(c,lVar12);
        iVar18 = 1;
        if (!_Var6) {
          lVar14.x = (p->grid).x;
          lVar14.y = (p->grid).y;
          wVar8 = motion_dir(lVar12,lVar14);
          lVar14 = next_grid(lVar12,wVar8);
          _Var6 = loc_eq((loc_conflict)lVar14,(loc_conflict)lVar12);
          iVar18 = 1;
          if (!_Var6) {
            _Var6 = square_allowslos(c,lVar14);
            if ((_Var6) && (_Var6 = square_isroom(c,lVar14), _Var6)) {
              _Var6 = square_isglow(c,lVar14);
              iVar18 = 1;
              if (_Var6) goto LAB_00128db2;
            }
            uVar20 = (ulong)lVar14 & 0xffffffff00000000;
            wVar8 = lVar12.x;
            if (lVar14.x == wVar8) {
              lVar14 = (loc)((uint)(wVar8 + L'\xffffffff') | uVar20);
              _Var6 = square_in_bounds(c,lVar14);
              if (((_Var6) && (_Var6 = square_allowslos(c,lVar14), _Var6)) &&
                 ((_Var6 = square_isroom(c,lVar14), _Var6 &&
                  (_Var6 = square_isglow(c,lVar14), _Var6)))) {
                _Var6 = source_can_light_wall(c,p,(loc_conflict)lVar14,(loc_conflict)lVar12);
                iVar18 = 1;
                if (_Var6) goto LAB_00128db2;
              }
              lVar14 = (loc)(uVar20 | (uint)(wVar8 + L'\x01'));
LAB_00128cfd:
              _Var6 = square_in_bounds(c,lVar14);
              if (!_Var6) goto LAB_00128db0;
            }
            else {
              uVar16 = (ulong)lVar14 & 0xffffffff;
              uVar21 = (ulong)lVar12 & 0xffffffff00000000;
              if (((ulong)lVar14 ^ (ulong)lVar12) >> 0x20 == 0) {
                lVar14 = (loc)(uVar21 - 0x100000000 | uVar16);
                _Var6 = square_in_bounds(c,lVar14);
                if ((((_Var6) && (_Var6 = square_allowslos(c,lVar14), _Var6)) &&
                    (_Var6 = square_isroom(c,lVar14), _Var6)) &&
                   (_Var6 = square_isglow(c,lVar14), _Var6)) {
                  _Var6 = source_can_light_wall(c,p,(loc_conflict)lVar14,(loc_conflict)lVar12);
                  iVar18 = 1;
                  if (_Var6) goto LAB_00128db2;
                }
                lVar14 = (loc)(uVar21 + uVar16 + 0x100000000);
                goto LAB_00128cfd;
              }
              lVar14 = (loc)(uVar16 | uVar21);
              _Var6 = square_allowslos(c,lVar14);
              if (((_Var6) && (_Var6 = square_isroom(c,lVar14), _Var6)) &&
                 (_Var6 = square_isglow(c,lVar14), _Var6)) {
                _Var6 = source_can_light_wall(c,p,(loc_conflict)lVar14,(loc_conflict)lVar12);
                iVar18 = 1;
                if (_Var6) goto LAB_00128db2;
              }
              lVar14 = (loc)(uVar20 | (ulong)lVar12 & 0xffffffff);
            }
            _Var6 = square_allowslos(c,lVar14);
            if (((_Var6) && (_Var6 = square_isroom(c,lVar14), _Var6)) &&
               (_Var6 = square_isglow(c,lVar14), _Var6)) {
              _Var6 = source_can_light_wall(c,p,(loc_conflict)lVar14,(loc_conflict)lVar12);
              iVar18 = 1;
              if (_Var6) goto LAB_00128db2;
            }
LAB_00128db0:
            iVar18 = 0;
          }
        }
      }
LAB_00128db2:
      c->squares[lVar23][lVar26].light = iVar18;
      _Var6 = square_isbright(c,lVar12);
      if (_Var6) {
        piVar2 = &c->squares[lVar23][lVar26].light;
        *piVar2 = *piVar2 + 2;
        for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
          lVar14 = (loc)loc_sum((loc_conflict)lVar12,(loc_conflict)ddgrid_ddd[lVar24]);
          _Var6 = square_in_bounds(c,lVar14);
          if ((_Var6) &&
             ((_Var6 = square_allowslos(c,lVar14), _Var6 ||
              (_Var6 = source_can_light_wall(c,p,(loc_conflict)lVar12,(loc_conflict)lVar14), _Var6))
             )) {
            piVar2 = &c->squares[(long)lVar14 >> 0x20][lVar14.x].light;
            *piVar2 = *piVar2 + 1;
          }
        }
      }
    }
  }
  add_light(c,p,p->grid,wVar9 + L'\xffffffff',wVar19);
  for (wVar19 = L'\x01'; wVar9 = cave_monster_max(c), wVar19 < wVar9; wVar19 = wVar19 + L'\x01') {
    mon = cave_monster(c,wVar19);
    if ((mon->race != (monster_race *)0x0) && (_Var5 = monster_is_camouflaged(mon), !_Var5)) {
      wVar9 = mon->race->light;
      wVar8 = -wVar9;
      if (L'\0' < wVar9) {
        wVar8 = wVar9;
      }
      if (wVar9 != L'\0') {
        lVar15 = mon->grid;
        wVar10 = distance(p->grid,lVar15);
        if (wVar10 - (wVar8 + L'\xffffffff') <= (int)(uint)z_info->max_sight) {
          add_light(c,p,lVar15,wVar8 + L'\xffffffff',wVar9);
        }
      }
    }
  }
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  wVar19 = square_light(c,grid);
  if (wVar19 != wVar7) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x2000000;
  }
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  psVar13 = square(c,grid_00);
  flag_on_dbg(psVar13->info,3,6,"square(c, p->grid)->info","SQUARE_VIEW");
  if ((((L'\0' < (p->state).cur_light) ||
       (grid_01.x = (p->grid).x, grid_01.y = (p->grid).y, _Var5 = square_islit(c,grid_01), _Var5))
      || (_Var5 = flag_has_dbg((p->state).pflags,10,0x1f,"p->state.pflags","(PF_UNLIGHT)"), _Var5))
     || (_Var5 = player_of_has(p,L'+'), _Var5)) {
    grid_02.x = (p->grid).x;
    grid_02.y = (p->grid).y;
    psVar13 = square(c,grid_02);
    flag_on_dbg(psVar13->info,3,5,"square(c, p->grid)->info","SQUARE_SEEN");
    grid_03.x = (p->grid).x;
    grid_03.y = (p->grid).y;
    psVar13 = square(c,grid_03);
    flag_on_dbg(psVar13->info,3,0x15,"square(c, p->grid)->info","SQUARE_CLOSE_PLAYER");
  }
  if (((p->timed[2] != 0) &&
      (grid_04.x = (p->grid).x, grid_04.y = (p->grid).y, _Var5 = square_isknown(c,grid_04), _Var5))
     && (grid_05.x = (p->grid).x, grid_05.y = (p->grid).y,
        _Var5 = square_ispassable((chunk_conflict *)p->cave,grid_05), !_Var5)) {
    grid_06.x = (p->grid).x;
    grid_06.y = (p->grid).y;
    square_forget(c,grid_06);
  }
  iVar18 = 0;
  do {
    iVar25 = c->height;
    y_00 = 0;
    if (iVar25 <= iVar18) {
      for (; y_00 < iVar25; y_00 = y_00 + 1) {
        for (iVar18 = 0; iVar18 < c->width; iVar18 = iVar18 + 1) {
          lVar12 = (loc)loc(iVar18,y_00);
          if (p->timed[2] == 0) {
            _Var5 = square_isseen(c,lVar12);
            if (_Var5) {
              square_reveal_trap((chunk *)c,lVar12,false,true);
            }
          }
          else {
            psVar13 = square(c,lVar12);
            flag_off(psVar13->info,3,5);
            psVar13 = square(c,lVar12);
            flag_off(psVar13->info,3,0x15);
          }
          _Var5 = square_isseen(c,lVar12);
          if ((_Var5) && (_Var5 = square_wasseen(c,lVar12), !_Var5)) {
            _Var5 = square_isfeel(c,lVar12);
            if (_Var5) {
              c->feeling_squares = c->feeling_squares + 1;
              psVar13 = square(c,lVar12);
              flag_off(psVar13->info,3,8);
              if (((ushort)(byte)c->feeling_squares == z_info->feeling_need) &&
                 (p->upkeep->only_partial == false)) {
                display_feeling(true);
                puVar1 = &p->upkeep->redraw;
                *puVar1 = *puVar1 | 0x1000000;
              }
            }
            square_note_spot((chunk *)c,lVar12);
            square_light_spot((chunk *)c,lVar12);
          }
          _Var5 = square_isseen(c,lVar12);
          if ((!_Var5) && (_Var5 = square_wasseen(c,lVar12), _Var5)) {
            square_light_spot((chunk *)c,lVar12);
          }
          psVar13 = square(c,lVar12);
          flag_off(psVar13->info,3,7);
        }
        iVar25 = c->height;
      }
      return;
    }
    for (; y_00 < c->width; y_00 = y_00 + 1) {
      lVar12 = (loc)loc(y_00,iVar18);
      wVar19 = distance((loc_conflict)lVar12,p->grid);
      if ((uint)wVar19 <= (uint)z_info->max_sight) {
        wVar9 = (p->state).cur_light;
        _Var5 = flag_has_dbg((p->state).pflags,10,0x1f,"p->state.pflags","(PF_UNLIGHT)");
        if (((_Var5) || (_Var5 = player_of_has(p,L'+'), _Var5)) &&
           (wVar7 = (p->state).cur_light, wVar7 < L'\x02')) {
          wVar9 = (short)(p->lev / 6 + 2) - wVar7;
        }
        wVar10 = lVar12.y;
        _Var5 = square_allowslos(c,lVar12);
        x_00 = lVar12.x;
        wVar8 = x_00;
        wVar7 = wVar10;
        if (!_Var5) {
          wVar7 = (p->grid).y;
          iVar11 = wVar10 - wVar7;
          wVar8 = (p->grid).x;
          iVar25 = -(uint)(wVar7 < wVar10);
          if (wVar10 < wVar7) {
            iVar25 = 1;
          }
          iVar17 = x_00 - wVar8;
          iVar22 = -(uint)(wVar8 < x_00);
          if (x_00 < wVar8) {
            iVar22 = 1;
          }
          iVar3 = -iVar17;
          if (0 < iVar17) {
            iVar3 = iVar17;
          }
          iVar4 = -iVar11;
          if (0 < iVar11) {
            iVar4 = iVar11;
          }
          iVar17 = (uint)(0 < iVar17) * 2 + -1;
          iVar11 = (uint)(0 < iVar11) * 2 + -1;
          lVar14 = (loc)loc(iVar22 + x_00,iVar25 + wVar10);
          _Var5 = square_allowslos(c,lVar14);
          wVar8 = iVar22 + x_00;
          wVar7 = iVar25 + wVar10;
          if (!_Var5) {
            wVar8 = x_00;
            wVar7 = wVar10;
          }
          if (iVar4 == 1 && iVar3 == 2) {
            iVar17 = x_00 - iVar17;
            lVar14 = (loc)loc(iVar17,wVar10);
            _Var5 = square_allowslos(c,lVar14);
            if (_Var5) {
              lVar14 = (loc)loc(iVar17,wVar10 - iVar11);
LAB_0012927e:
              _Var5 = square_allowslos(c,lVar14);
              if (!_Var5) {
                wVar8 = x_00;
                wVar7 = wVar10;
              }
            }
          }
          else if (iVar4 == 2 && iVar3 == 1) {
            iVar11 = wVar10 - iVar11;
            lVar14 = (loc)loc(x_00,iVar11);
            _Var5 = square_allowslos(c,lVar14);
            if (_Var5) {
              lVar14 = (loc)loc(x_00 - iVar17,iVar11);
              goto LAB_0012927e;
            }
          }
        }
        lVar15 = loc(wVar8,wVar7);
        _Var5 = los(c,p->grid,lVar15);
        if ((_Var5) && (_Var5 = square_isview(c,lVar12), !_Var5)) {
          psVar13 = square(c,lVar12);
          flag_on_dbg(psVar13->info,3,6,"square(c, grid)->info","SQUARE_VIEW");
          if (wVar19 < wVar9) {
            psVar13 = square(c,lVar12);
            flag_on_dbg(psVar13->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
            psVar13 = square(c,lVar12);
            flag_on_dbg(psVar13->info,3,0x15,"square(c, grid)->info","SQUARE_CLOSE_PLAYER");
          }
          _Var5 = square_islit(c,lVar12);
          if (_Var5) {
            _Var5 = square_allowslos(c,lVar12);
            if (!_Var5) {
              wVar19 = (p->grid).x;
              wVar9 = (p->grid).y;
              iVar25 = -(uint)(wVar9 < wVar10);
              if (wVar10 < wVar9) {
                iVar25 = 1;
              }
              iVar11 = -(uint)(wVar19 < x_00);
              if (x_00 < wVar19) {
                iVar11 = 1;
              }
              lVar14 = (loc)loc(iVar11 + x_00,iVar25 + wVar10);
              _Var5 = square_islit(c,lVar14);
              if (!_Var5) goto LAB_001293f5;
            }
            psVar13 = square(c,lVar12);
            flag_on_dbg(psVar13->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
          }
        }
      }
LAB_001293f5:
    }
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

void update_view(struct chunk *c, struct player *p)
{
	int x, y;

	/* Record the current view */
	mark_wasseen(c);

	/* Calculate light levels */
	calc_lighting(c, p);

	/* Assume we can view the player grid */
	sqinfo_on(square(c, p->grid)->info, SQUARE_VIEW);
	if (p->state.cur_light > 0 || square_islit(c, p->grid) ||
		player_has(p, PF_UNLIGHT) || player_of_has(p, OF_DARKNESS)) {
		sqinfo_on(square(c, p->grid)->info, SQUARE_SEEN);
		sqinfo_on(square(c, p->grid)->info, SQUARE_CLOSE_PLAYER);
	}
	/*
	 * If the player is blind and in terrain that was remembered to be
	 * impassable, forget the remembered terrain.  This will have to be
	 * modified in variants that have timed effects which allow a player
	 * to move through impassable terrain.
	 */
	if (p->timed[TMD_BLIND] && square_isknown(c, p->grid)
			&& !square_ispassable(p->cave, p->grid)) {
		square_forget(c, p->grid);
	}

	/* Squares we have LOS to get marked as in the view, and perhaps seen */
	for (y = 0; y < c->height; y++)
		for (x = 0; x < c->width; x++)
			update_view_one(c, loc(x, y), p);

	/* Update each grid */
	for (y = 0; y < c->height; y++)
		for (x = 0; x < c->width; x++)
			update_one(c, loc(x, y), p);
}